

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O2

int ProcessRawProfile(char *profile,size_t profile_len,MetadataPayload *payload)

{
  char cVar1;
  long lVar2;
  uint8_t *__ptr;
  char *pcVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong __size;
  char local_4b;
  char local_4a;
  char local_49;
  MetadataPayload *local_48;
  char *end;
  char *end_1;
  
  if (profile_len == 0 || profile == (char *)0x0) {
    return 0;
  }
  if (*profile == '\n') {
    pcVar3 = profile + 1;
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\n');
    lVar2 = strtol(pcVar3,&end,10);
    if (*end == '\n') {
      pcVar3 = end + 1;
      __size = (ulong)(int)lVar2;
      end = pcVar3;
      __ptr = (uint8_t *)malloc(__size);
      if (__ptr != (uint8_t *)0x0) {
        uVar5 = 0;
        puVar4 = __ptr;
        local_48 = payload;
        do {
          if ((__size <= uVar5) || (cVar1 = *pcVar3, cVar1 == '\0')) goto LAB_001051bb;
          if (cVar1 != '\n') {
            local_4a = pcVar3[1];
            local_49 = '\0';
            local_4b = cVar1;
            lVar2 = strtol(&local_4b,&end_1,0x10);
            *puVar4 = (uint8_t)lVar2;
            uVar5 = uVar5 + (end_1 == &local_49);
            if (end_1 != &local_49) goto LAB_001051bb;
            pcVar3 = pcVar3 + 1;
            puVar4 = puVar4 + 1;
          }
          pcVar3 = pcVar3 + 1;
        } while( true );
      }
      goto LAB_001051dd;
    }
  }
  fprintf(stderr,"Malformed raw profile, expected \'\\n\' got \'\\x%.2X\'\n");
  return 0;
LAB_001051bb:
  payload = local_48;
  if (uVar5 == __size) {
    local_48->bytes = __ptr;
    local_48->size = __size;
    return 1;
  }
  free(__ptr);
LAB_001051dd:
  payload->bytes = (uint8_t *)0x0;
  return 0;
}

Assistant:

static int ProcessRawProfile(const char* profile, size_t profile_len,
                             MetadataPayload* const payload) {
  const char* src = profile;
  char* end;
  int expected_length;

  if (profile == NULL || profile_len == 0) return 0;

  // ImageMagick formats 'raw profiles' as
  // '\n<name>\n<length>(%8lu)\n<hex payload>\n'.
  if (*src != '\n') {
    fprintf(stderr, "Malformed raw profile, expected '\\n' got '\\x%.2X'\n",
            *src);
    return 0;
  }
  ++src;
  // skip the profile name and extract the length.
  while (*src != '\0' && *src++ != '\n') {}
  expected_length = (int)strtol(src, &end, 10);
  if (*end != '\n') {
    fprintf(stderr, "Malformed raw profile, expected '\\n' got '\\x%.2X'\n",
            *end);
    return 0;
  }
  ++end;

  // 'end' now points to the profile payload.
  payload->bytes = HexStringToBytes(end, expected_length);
  if (payload->bytes == NULL) return 0;
  payload->size = expected_length;
  return 1;
}